

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

config_value * parser_parse_number(parser *parser,char *value)

{
  natwm_error nVar1;
  undefined8 in_R9;
  undefined8 uVar2;
  config_value *config_value;
  intmax_t iStack_28;
  natwm_error err;
  intmax_t number;
  char *value_local;
  parser *parser_local;
  
  uVar2 = 0x1092f5;
  iStack_28 = 0;
  number = (intmax_t)value;
  value_local = (char *)parser;
  nVar1 = string_to_number(value,&stack0xffffffffffffffd8);
  if (nVar1 == NO_ERROR) {
    parser_local = (parser *)config_value_create_number(iStack_28);
    if (parser_local == (parser *)0x0) {
      parser_local = (parser *)0x0;
    }
    else {
      free((void *)number);
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Invalid numeric value \'%s\' found - Line %zu",number,
                    *(undefined8 *)(value_local + 0x18),in_R9,uVar2);
    parser_local = (parser *)0x0;
  }
  return (config_value *)parser_local;
}

Assistant:

static struct config_value *parser_parse_number(const struct parser *parser, char *value)
{
        intmax_t number = 0;
        enum natwm_error err = string_to_number(value, &number);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Invalid numeric value '%s' found - Line %zu",
                          value,
                          parser->line_num);

                return NULL;
        }

        struct config_value *config_value = config_value_create_number(number);

        if (config_value == NULL) {
                return NULL;
        }

        // We no longer need this value
        free(value);

        return config_value;
}